

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O1

void __thiscall
fizplex::SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test::TestBody
          (SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test *this)

{
  LP *this_00;
  bool bVar1;
  char *pcVar2;
  initializer_list<double> l;
  initializer_list<double> l_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  DVector local_48;
  DVector local_30;
  
  this_00 = &(this->super_SimplexTest).lp;
  LP::add_column(this_00,Bounded,0.0,5.0,-1.0);
  LP::add_column(this_00,Bounded,0.0,5.0,0.0);
  local_48.vals._M_size = (size_t)&DAT_3ff0000000000000;
  local_48.vals._M_data = (double *)&DAT_bff0000000000000;
  l._M_len = 2;
  l._M_array = (iterator)&local_48;
  DVector::DVector(&local_30,l);
  LP::add_row(this_00,Equality,0.0,0.0,&local_30);
  operator_delete(local_30.vals._M_data);
  SimplexTest::solve_lp(&this->super_SimplexTest);
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<fizplex::Simplex::Result,fizplex::Simplex::Result>
            ((internal *)&local_48,"Simplex::Result::OptimalSolution","result",(Result *)&local_68,
             &(this->super_SimplexTest).result);
  if ((char)local_48.vals._M_size == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_48.vals._M_data == (double *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_48.vals._M_data;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.vals._M_data,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_48,"-5.0","z",-5.0,(this->super_SimplexTest).z);
  if ((char)local_48.vals._M_size == '\0') {
    testing::Message::Message((Message *)&local_68);
    if (local_48.vals._M_data == (double *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_48.vals._M_data;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68.data_ + 8))();
      }
      local_68.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.vals._M_data,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.data_ = (AssertHelperData *)0x4014000000000000;
  uStack_60 = 0x4014000000000000;
  local_58 = 0;
  l_00._M_len = 3;
  l_00._M_array = (iterator)&local_68;
  DVector::DVector(&local_48,l_00);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            ((internal *)&local_78,"DVector({5.0, 5.0, 0.0})","x",&local_48,
             &(this->super_SimplexTest).x);
  operator_delete(local_48.vals._M_data);
  if (local_78.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_48.vals._M_size != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_48.vals._M_size != (long *)0x0)) {
        (**(code **)(*(long *)local_48.vals._M_size + 8))();
      }
      local_48.vals._M_size = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(SimplexTest, EqualityRowBoundedVarsOptimalSolution) {
  lp.add_column(ColType::Bounded, 0, 5, -1);
  lp.add_column(ColType::Bounded, 0, 5, 0);
  lp.add_row(RowType::Equality, 0, 0, {1, -1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-5.0, z);
  EXPECT_EQ(DVector({5.0, 5.0, 0.0}), x);
}